

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::MultiPartInputFile::flushPartCache(MultiPartInputFile *this)

{
  bool bVar1;
  element_type *peVar2;
  mutex_type *in_RDI;
  Part *part;
  iterator __end1;
  iterator __begin1;
  vector<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
  *__range1;
  lock_guard<std::mutex> lock;
  reference in_stack_ffffffffffffffd0;
  __normal_iterator<Imf_3_4::MultiPartInputFile::Data::Part_*,_std::vector<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>_>
  local_20;
  vector<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
  *local_18;
  
  std::
  __shared_ptr_access<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x20823b);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffd0,in_RDI);
  peVar2 = std::
           __shared_ptr_access<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x208255);
  local_18 = &peVar2->parts;
  local_20._M_current =
       (Part *)std::
               vector<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
               ::begin((vector<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
                        *)in_RDI);
  std::
  vector<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
  ::end((vector<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
         *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Imf_3_4::MultiPartInputFile::Data::Part_*,_std::vector<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<Imf_3_4::MultiPartInputFile::Data::Part_*,_std::vector<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<Imf_3_4::MultiPartInputFile::Data::Part_*,_std::vector<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>_>
         ::operator*(&local_20);
    std::any::reset((any *)in_stack_ffffffffffffffd0);
    __gnu_cxx::
    __normal_iterator<Imf_3_4::MultiPartInputFile::Data::Part_*,_std::vector<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>_>
    ::operator++(&local_20);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2082c4);
  return;
}

Assistant:

void
MultiPartInputFile::flushPartCache ()
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif
    for (auto &part: _data->parts)
        part.file.reset();
}